

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_ild.c
# Opt level: O1

pt_exec_mode pti_get_nominal_eosz(pt_ild *ild)

{
  ushort uVar1;
  pt_exec_mode pVar2;
  
  uVar1 = *(ushort *)&ild->field_0x10;
  if (ild->mode != ptem_32bit) {
    if (ild->mode == ptem_64bit) {
      pVar2 = ptem_64bit;
      if ((uVar1 >> 9 & 1) == 0) goto LAB_0010aa58;
    }
    else {
      pVar2 = (uVar1 & 1) + ptem_16bit;
    }
    return pVar2;
  }
LAB_0010aa58:
  return ptem_32bit - (uVar1 & 1);
}

Assistant:

static inline enum pt_exec_mode
pti_get_nominal_eosz(const struct pt_ild *ild)
{
	if (mode_64b(ild)) {
		if (ild->rex_w)
			return ptem_64bit;
		if (ild->osz)
			return ptem_16bit;
		return ptem_32bit;
	}
	return pti_get_nominal_eosz_non64(ild);
}